

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFXRefEntry.cc
# Opt level: O0

int __thiscall QPDFXRefEntry::getObjStreamIndex(QPDFXRefEntry *this)

{
  logic_error *this_00;
  QPDFXRefEntry *this_local;
  
  if (this->type != 2) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"getObjStreamIndex called for xref entry of type != 2");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return this->field2;
}

Assistant:

int
QPDFXRefEntry::getObjStreamIndex() const
{
    if (this->type != 2) {
        throw std::logic_error("getObjStreamIndex called for xref entry of type != 2");
    }
    return this->field2;
}